

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  bool bVar1;
  reference this_00;
  cmFileLockResult cVar2;
  cmFileLock *lock;
  iterator __end1;
  iterator __begin1;
  List *__range1;
  string *filename_local;
  ScopePool *this_local;
  
  __end1 = std::vector<cmFileLock,_std::allocator<cmFileLock>_>::begin(&this->Locks);
  lock = (cmFileLock *)std::vector<cmFileLock,_std::allocator<cmFileLock>_>::end(&this->Locks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmFileLock_*,_std::vector<cmFileLock,_std::allocator<cmFileLock>_>_>
                                *)&lock);
    if (!bVar1) {
      cVar2 = cmFileLockResult::MakeOk();
      return cVar2;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<cmFileLock_*,_std::vector<cmFileLock,_std::allocator<cmFileLock>_>_>
              ::operator*(&__end1);
    bVar1 = cmFileLock::IsLocked(this_00,filename);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFileLock_*,_std::vector<cmFileLock,_std::allocator<cmFileLock>_>_>::
    operator++(&__end1);
  }
  cVar2 = cmFileLock::Release(this_00);
  return cVar2;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
  const std::string& filename)
{
  for (auto& lock : this->Locks) {
    if (lock.IsLocked(filename)) {
      return lock.Release();
    }
  }
  return cmFileLockResult::MakeOk();
}